

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Stress::VertexAttributeBindingTests::init
          (VertexAttributeBindingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *node;
  SingleBindingCase *pSVar3;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unaligned",
             "Unaligned access");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "buffer_bounds","Source data over buffer bounds");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,node);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"elements_1_unaligned",1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"offset_elements_1_unaligned",0x11);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"unaligned_offset_elements_1",0x20);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"unaligned_offset_elements_1_unaligned",
             0x21);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"unaligned_offset_elements_2",0x24);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,
             "unaligned_offset_elements_2_share_elements",0x28);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"unaligned_stride_elements_1",0x40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"unaligned_stride_elements_2",0x44);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (SingleBindingCase *)operator_new(0xa0);
  Stress::anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar3,(this->super_TestCaseGroup).m_context,
             "unaligned_stride_elements_2_share_elements",0x48);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"bind_vertex_buffer_offset_over_bounds_10",
             "Offset over buffer bounds");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindVertexBufferCase_021678c0;
  pTVar2[1].m_testCtx = (TestContext *)0xa00210000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"bind_vertex_buffer_offset_over_bounds_1000",
             "Offset over buffer bounds");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindVertexBufferCase_021678c0;
  pTVar2[1].m_testCtx = (TestContext *)0x3e800210000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"bind_vertex_buffer_offset_near_wrap_10",
             "Offset over buffer bounds, near wrapping");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindVertexBufferCase_021678c0;
  pTVar2[1].m_testCtx = (TestContext *)0xa7ffffff0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"bind_vertex_buffer_offset_near_wrap_1000",
             "Offset over buffer bounds, near wrapping");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindVertexBufferCase_021678c0;
  pTVar2[1].m_testCtx = (TestContext *)0x3e87ffffff0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild(node,pTVar2);
  return extraout_EAX;
}

Assistant:

void VertexAttributeBindingTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned",		"Unaligned access");
	tcu::TestCaseGroup* const bufferRangeGroup	= new tcu::TestCaseGroup(m_testCtx, "buffer_bounds",	"Source data over buffer bounds");

	addChild(unalignedGroup);
	addChild(bufferRangeGroup);

	// .unaligned
	{
		unalignedGroup->addChild(new SingleBindingCase(m_context, "elements_1_unaligned",																		  SingleBindingCase::FLAG_ATTRIB_UNALIGNED));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "offset_elements_1_unaligned",				SingleBindingCase::FLAG_BUF_ALIGNED_OFFSET		| SingleBindingCase::FLAG_ATTRIB_UNALIGNED));

		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_1",				SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| 0));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_1_unaligned",		SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| SingleBindingCase::FLAG_ATTRIB_UNALIGNED));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_2",				SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| SingleBindingCase::FLAG_ATTRIBS_MULTIPLE_ELEMS));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_2_share_elements",	SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| SingleBindingCase::FLAG_ATTRIBS_SHARED_ELEMS));

		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_stride_elements_1",				SingleBindingCase::FLAG_BUF_UNALIGNED_STRIDE	| 0));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_stride_elements_2",				SingleBindingCase::FLAG_BUF_UNALIGNED_STRIDE	| SingleBindingCase::FLAG_ATTRIBS_MULTIPLE_ELEMS));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_stride_elements_2_share_elements",	SingleBindingCase::FLAG_BUF_UNALIGNED_STRIDE	| SingleBindingCase::FLAG_ATTRIBS_SHARED_ELEMS));
	}

	// .buffer_bounds
	{
		// bind buffer offset cases
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_over_bounds_10",		"Offset over buffer bounds",				0x00210000, 10));
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_over_bounds_1000",	"Offset over buffer bounds",				0x00210000, 1000));
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_near_wrap_10",		"Offset over buffer bounds, near wrapping",	0x7FFFFFF0, 10));
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_near_wrap_1000",		"Offset over buffer bounds, near wrapping",	0x7FFFFFF0, 1000));
	}
}